

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall MixedArena::clear(MixedArena *this)

{
  bool bVar1;
  reference ppvVar2;
  void *chunk;
  iterator __end1;
  iterator __begin1;
  vector<void_*,_std::allocator<void_*>_> *__range1;
  MixedArena *this_local;
  
  __end1 = std::vector<void_*,_std::allocator<void_*>_>::begin(&this->chunks);
  chunk = (void *)std::vector<void_*,_std::allocator<void_*>_>::end(&this->chunks);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                                *)&chunk);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
              operator*(&__end1);
    wasm::aligned_free(*ppvVar2);
    __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::operator++
              (&__end1);
  }
  std::vector<void_*,_std::allocator<void_*>_>::clear(&this->chunks);
  return;
}

Assistant:

void clear() {
    for (auto* chunk : chunks) {
      wasm::aligned_free(chunk);
    }
    chunks.clear();
  }